

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<double_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<double_const&> *this,int *rhs)

{
  int iVar1;
  lest *this_00;
  int *in_R8;
  allocator local_71;
  double local_70;
  string local_68;
  string local_48 [32];
  
  this_00 = *(lest **)this;
  local_70 = *(double *)this_00;
  iVar1 = *rhs;
  std::__cxx11::string::string(local_48,"==",&local_71);
  to_string<double,int>(&local_68,this_00,(double *)local_48,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = local_70 == (double)iVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result( lhs != rhs, to_string( lhs, "!=", rhs ) ); }